

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O0

void __thiscall
dlib::drawable_window::set_background_color
          (drawable_window *this,unsigned_long red_,unsigned_long green_,unsigned_long blue_)

{
  base_window *in_RCX;
  undefined1 in_DL;
  undefined1 in_SIL;
  long in_RDI;
  rectangle rect;
  unsigned_long height;
  unsigned_long width;
  unsigned_long in_stack_ffffffffffffffb8;
  rmutex *in_stack_ffffffffffffffc0;
  unsigned_long *in_stack_ffffffffffffffd0;
  unsigned_long *in_stack_ffffffffffffffd8;
  
  rmutex::lock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined1 *)(in_RDI + 0x48) = in_SIL;
  *(undefined1 *)(in_RDI + 0x49) = in_DL;
  *(char *)(in_RDI + 0x4a) = (char)in_RCX;
  rmutex::unlock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  base_window::get_size(in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  rectangle::rectangle
            ((rectangle *)&stack0xffffffffffffffb0,0,0,(long)in_stack_ffffffffffffffd8 + -1,
             (long)in_stack_ffffffffffffffd0 + -1);
  base_window::invalidate_rectangle((base_window *)width,(rectangle *)height);
  return;
}

Assistant:

void drawable_window::
    set_background_color (
        unsigned long red_,
        unsigned long green_,
        unsigned long blue_
    )
    {
        wm.lock();
        bg_color.red = red_;
        bg_color.green = green_;
        bg_color.blue = blue_;
        wm.unlock();
        // now repaint the window
        unsigned long width,height;
        get_size(width,height);
        rectangle rect(0,0,width-1,height-1);
        invalidate_rectangle(rect);
    }